

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::Chapters::ExpandEditionsArray(Chapters *this)

{
  int iVar1;
  uint uVar2;
  Edition *pEVar3;
  long *plVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  
  iVar1 = this->m_editions_size;
  uVar2 = this->m_editions_count;
  bVar6 = true;
  if (iVar1 <= (int)uVar2) {
    iVar7 = 1;
    if (iVar1 != 0) {
      iVar7 = iVar1 * 2;
    }
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar7) {
      uVar5 = (long)iVar7 << 4 | 8;
    }
    plVar4 = (long *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
    uVar5 = 0;
    if (plVar4 == (long *)0x0) {
      bVar6 = false;
    }
    else {
      *plVar4 = (long)iVar7;
      pEVar3 = this->m_editions;
      uVar8 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar8 = uVar5;
      }
      for (; uVar8 * 0x10 != uVar5; uVar5 = uVar5 + 0x10) {
        *(undefined8 *)((long)plVar4 + uVar5 + 8) = *(undefined8 *)((long)&pEVar3->m_atoms + uVar5);
        *(undefined8 *)((long)plVar4 + uVar5 + 0x10) =
             *(undefined8 *)((long)&pEVar3->m_atoms_size + uVar5);
      }
      if (pEVar3 != (Edition *)0x0) {
        operator_delete__(&pEVar3[-1].m_atoms_size);
      }
      this->m_editions = (Edition *)(plVar4 + 1);
      this->m_editions_size = iVar7;
    }
  }
  return bVar6;
}

Assistant:

bool Chapters::ExpandEditionsArray() {
  if (m_editions_size > m_editions_count)
    return true;  // nothing else to do

  const int size = (m_editions_size == 0) ? 1 : 2 * m_editions_size;

  Edition* const editions = new (std::nothrow) Edition[size];

  if (editions == NULL)
    return false;

  for (int idx = 0; idx < m_editions_count; ++idx) {
    m_editions[idx].ShallowCopy(editions[idx]);
  }

  delete[] m_editions;
  m_editions = editions;

  m_editions_size = size;
  return true;
}